

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

int __thiscall
embree::Points::verify
          (Points *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  BufferView<embree::Vec3fx> *pBVar1;
  float *pfVar2;
  size_t sVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  iterator __begin1;
  BufferView<embree::Vec3fx> *pBVar10;
  float *pfVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  
  sVar3 = (this->vertices).size_active;
  if (sVar3 != 0) {
    pBVar10 = (this->vertices).items;
    pBVar1 = pBVar10 + sVar3;
    lVar9 = sVar3 * 0x38 + -0x38;
    lVar7 = 0;
    do {
      lVar12 = lVar7;
      if (lVar9 == lVar12) goto LAB_00ac92de;
      lVar7 = lVar12 + 0x38;
    } while (*(size_t *)((long)&pBVar10[1].super_RawBufferView.num + lVar12) ==
             (pBVar10->super_RawBufferView).num);
    if (lVar9 == lVar12) {
LAB_00ac92de:
      sVar3 = (this->normals).size_active;
      if (*(char *)&(this->super_Geometry).field_8 == '\x1b') {
        if (sVar3 != 0) {
          pBVar4 = (this->normals).items;
          sVar5 = (pBVar10->super_RawBufferView).num;
          if (sVar5 == (pBVar4->super_RawBufferView).num) {
            lVar9 = sVar3 * 0x38 + -0x38;
            lVar7 = 0;
            do {
              lVar12 = lVar7;
              if (lVar9 == lVar12) goto LAB_00ac9334;
              lVar7 = lVar12 + 0x38;
            } while (sVar5 == *(size_t *)((long)&pBVar4[1].super_RawBufferView.num + lVar12));
            if (lVar9 == lVar12) goto LAB_00ac9334;
          }
        }
      }
      else if (sVar3 == 0) {
LAB_00ac9334:
        uVar8 = 0;
        do {
          uVar6 = (pBVar10->super_RawBufferView).num;
          bVar14 = uVar6 != 0;
          if (bVar14) {
            pfVar11 = (float *)(pBVar10->super_RawBufferView).ptr_ofs;
            if (ABS(*pfVar11) < 1.844e+18) {
              sVar3 = (pBVar10->super_RawBufferView).stride;
              pfVar11 = pfVar11 + 3;
              uVar13 = 1;
              do {
                if (((1.844e+18 <= ABS(pfVar11[-2])) || (1.844e+18 <= ABS(pfVar11[-1]))) ||
                   (1.844e+18 <= ABS(*pfVar11))) break;
                if (uVar6 == uVar13) goto LAB_00ac93bd;
                bVar14 = uVar13 < uVar6;
                pfVar2 = (float *)((long)pfVar11 + (sVar3 - 0xc));
                pfVar11 = (float *)((long)pfVar11 + sVar3);
                uVar13 = uVar13 + 1;
              } while (ABS(*pfVar2) < 1.844e+18);
            }
            if (bVar14) {
              return uVar8;
            }
          }
LAB_00ac93bd:
          pBVar10 = pBVar10 + 1;
          bVar14 = pBVar10 == pBVar1;
          uVar8 = (uint)bVar14;
          if (bVar14) {
            return (uint)bVar14;
          }
        } while( true );
      }
    }
  }
  return 0;
}

Assistant:

__forceinline size_t size     () const { return size_active; }